

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

uint32_t __thiscall ddd::DaTrie<true,_false,_false>::num_singles(DaTrie<true,_false,_false> *this)

{
  bool bVar1;
  uint32_t uVar2;
  const_reference this_00;
  size_t sVar3;
  vector<ddd::Bc,_std::allocator<ddd::Bc>_> *in_RDI;
  uint32_t unaff_retaddr;
  DaTrie<true,_false,_false> *in_stack_00000008;
  uint32_t i;
  uint32_t ret;
  uint local_10;
  uint32_t local_c;
  vector<ddd::Bc,_std::allocator<ddd::Bc>_> *upper;
  
  local_c = 0;
  upper = in_RDI;
  for (local_10 = 0; uVar2 = bc_size((DaTrie<true,_false,_false> *)0x173715), local_10 < uVar2;
      local_10 = local_10 + 1) {
    this_00 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)local_10);
    bVar1 = Bc::is_fixed(this_00);
    if ((bVar1) && (sVar3 = edge_size_(in_stack_00000008,unaff_retaddr,(size_t)upper), sVar3 == 1))
    {
      local_c = local_c + 1;
    }
  }
  return local_c;
}

Assistant:

uint32_t num_singles() const { // not in constant time
    uint32_t ret = 0;
    for (uint32_t i = 0; i < bc_size(); ++i) {
      if (!bc_[i].is_fixed()) {
        continue;
      }
      if (edge_size_(i, 2) == 1) {
        ++ret;
      }
    }
    return ret;
  }